

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoverSymbols.cpp
# Opt level: O3

CoverpointSymbol * slang::ast::CoverpointSymbol::fromSyntax(Scope *scope,CoverpointSyntax *syntax)

{
  undefined1 *puVar1;
  Compilation *args;
  SyntaxNode *pSVar2;
  size_t sVar3;
  pointer ppMVar4;
  CoverageOptionSyntax *syntax_00;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_01;
  int iVar5;
  CoverpointSymbol *this;
  SourceLocation SVar6;
  undefined4 extraout_var;
  EVP_PKEY_CTX *src;
  EVP_PKEY_CTX *extraout_RDX;
  EVP_PKEY_CTX *extraout_RDX_00;
  size_t extraout_RDX_01;
  Token *this_00;
  long lVar7;
  Scope *this_01;
  OptionBuilder options;
  StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::SyntaxNode_*>,_96UL,_16UL>
  local_218;
  SourceLocation local_210;
  Token local_208;
  undefined1 local_1f8 [32];
  CoverageOptionSetter local_1d8 [4];
  undefined1 local_178 [96];
  SourceLocation local_118;
  SourceLocation local_110;
  undefined8 local_108;
  long local_100;
  undefined1 *local_f8;
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::SyntaxNode_*>
  *ppStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined1 local_d8 [96];
  SourceLocation local_78;
  SourceLocation local_70;
  undefined8 local_68;
  long local_60;
  undefined1 *local_58;
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::SyntaxNode_*>
  *ppStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  args = scope->compilation;
  if (((syntax->coverpoint).field_0x2 & 1) == 0) {
    local_208 = (Token)ZEXT816(0);
    if (syntax->label == (NamedLabelSyntax *)0x0) {
      pSVar2 = &((syntax->expr).ptr)->super_SyntaxNode;
      if (pSVar2->kind == IdentifierName) {
        local_1f8._0_16_ = *(undefined1 (*) [16])(pSVar2 + 1);
        this_00 = (Token *)local_1f8;
        local_208 = (Token)parsing::Token::valueText(this_00);
      }
      else {
        local_1f8._0_16_ = (undefined1  [16])slang::syntax::SyntaxNode::getFirstToken(pSVar2);
        this_00 = (Token *)local_1f8;
      }
    }
    else {
      local_208 = (Token)parsing::Token::valueText(&syntax->label->name);
      this_00 = &syntax->label->name;
    }
    local_210 = parsing::Token::location(this_00);
    this = BumpAllocator::
           emplace<slang::ast::CoverpointSymbol,slang::ast::Compilation&,std::basic_string_view<char,std::char_traits<char>>&,slang::SourceLocation&>
                     (&args->super_BumpAllocator,args,
                      (basic_string_view<char,_std::char_traits<char>_> *)&local_208,&local_210);
    (this->super_Symbol).originatingSyntax = (SyntaxNode *)syntax;
    syntax_01._M_ptr =
         (syntax->super_MemberSyntax).attributes.
         super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr;
    syntax_01._M_extent._M_extent_value =
         (syntax->super_MemberSyntax).attributes.
         super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
         _M_extent_value;
    Symbol::setAttributes(&this->super_Symbol,scope,syntax_01);
    (this->declaredType).typeOrLink = (anon_union_8_2_f12d5f64_for_typeOrLink)(syntax->type).ptr;
    puVar1 = &(this->declaredType).field_0x3f;
    *puVar1 = *puVar1 & 0x7f;
    pSVar2 = &((syntax->expr).ptr)->super_SyntaxNode;
    local_1f8._0_16_ = (undefined1  [16])slang::syntax::SyntaxNode::getFirstToken(pSVar2);
    SVar6 = parsing::Token::location((Token *)local_1f8);
    (this->declaredType).initializerSyntax = (ExpressionSyntax *)pSVar2;
    (this->declaredType).initializerLocation = SVar6;
    this_01 = &this->super_Scope;
    local_1f8._8_8_ = (Info *)(local_1f8 + 0x20);
    local_1f8._0_8_ = this_01;
    local_1f8._16_8_ = 0;
    local_1f8._24_8_ = 4;
    local_118 = (SourceLocation)((long)local_1f8 + 0x80);
    local_108 = 0x3f;
    src = (EVP_PKEY_CTX *)0x1;
    local_100 = 1;
    ppStack_f0 = (pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::SyntaxNode_*>
                  *)0x0;
    local_f8 = &boost::unordered::detail::foa::
                dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
                ::storage;
    local_e8 = 0;
    uStack_e0 = 0;
    local_78 = (SourceLocation)local_d8;
    local_68 = 0x3f;
    local_60 = 1;
    ppStack_50 = (pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::SyntaxNode_*>
                  *)0x0;
    local_58 = &boost::unordered::detail::foa::
                dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
                ::storage;
    local_48 = 0;
    uStack_40 = 0;
    sVar3 = (syntax->members).super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>.
            _M_extent._M_extent_value;
    local_110 = local_118;
    local_70 = local_78;
    if (sVar3 != 0) {
      ppMVar4 = (syntax->members).super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>.
                _M_ptr;
      lVar7 = 0;
      do {
        syntax_00 = *(CoverageOptionSyntax **)((long)ppMVar4 + lVar7);
        if ((syntax_00->super_MemberSyntax).super_SyntaxNode.kind == CoverageOption) {
          anon_unknown.dwarf_1e99b2e::OptionBuilder::add((OptionBuilder *)local_1f8,syntax_00);
          src = extraout_RDX;
        }
        else {
          Scope::addMembers(this_01,(SyntaxNode *)syntax_00);
          src = extraout_RDX_00;
        }
        lVar7 = lVar7 + 8;
      } while (sVar3 << 3 != lVar7);
      this_01 = (Scope *)local_1f8._0_8_;
    }
    iVar5 = SmallVectorBase<slang::ast::CoverageOptionSetter>::copy
                      ((SmallVectorBase<slang::ast::CoverageOptionSetter> *)(local_1f8 + 8),
                       (EVP_PKEY_CTX *)this_01->compilation,src);
    (this->options)._M_ptr = (pointer)CONCAT44(extraout_var,iVar5);
    (this->options)._M_extent._M_extent_value = extraout_RDX_01;
    local_218.storage = (Storage *)local_70;
    if (ppStack_50 !=
        (pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::SyntaxNode_*>
         *)0x0) {
      slang::detail::hashing::
      StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::SyntaxNode_*>,_96UL,_16UL>
      ::deallocate(&local_218,ppStack_50,(local_60 * 0x178 + 0x186U) / 0x18);
    }
    local_218.storage = (Storage *)local_110;
    if (ppStack_f0 !=
        (pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::SyntaxNode_*>
         *)0x0) {
      slang::detail::hashing::
      StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::SyntaxNode_*>,_96UL,_16UL>
      ::deallocate(&local_218,ppStack_f0,(local_100 * 0x178 + 0x186U) / 0x18);
    }
    if ((pointer)local_1f8._8_8_ != (pointer)(local_1f8 + 0x20)) {
      operator_delete((void *)local_1f8._8_8_);
    }
  }
  else {
    local_1f8._0_16_ = ZEXT816(0x9db414) << 0x40;
    local_208 = slang::syntax::SyntaxNode::getFirstToken((SyntaxNode *)syntax);
    local_218.storage = (Storage *)parsing::Token::location(&local_208);
    this = BumpAllocator::
           emplace<slang::ast::CoverpointSymbol,slang::ast::Compilation&,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation>
                     (&args->super_BumpAllocator,args,
                      (basic_string_view<char,_std::char_traits<char>_> *)local_1f8,
                      (SourceLocation *)&local_218);
    (this->declaredType).type = args->errorType;
  }
  return this;
}

Assistant:

CoverpointSymbol& CoverpointSymbol::fromSyntax(const Scope& scope, const CoverpointSyntax& syntax) {
    // It's possible for invalid syntax to parse as a coverpoint. If the keyword wasn't
    // given just give up and return a placeholder.
    auto& comp = scope.getCompilation();
    if (syntax.coverpoint.isMissing()) {
        auto result = comp.emplace<CoverpointSymbol>(comp, ""sv, syntax.getFirstToken().location());
        result->declaredType.setType(comp.getErrorType());
        return *result;
    }

    // Figure out the name of the coverpoint. If there's a label, it provides the name.
    // Otherwise check if the expression is a simple variable reference. If so, we take
    // that variable name as the name of the coverpoint. Otherwise it's unnamed.
    std::string_view name;
    SourceLocation loc;
    if (syntax.label) {
        name = syntax.label->name.valueText();
        loc = syntax.label->name.location();
    }
    else if (syntax.expr->kind == SyntaxKind::IdentifierName) {
        auto id = syntax.expr->as<IdentifierNameSyntax>().identifier;
        name = id.valueText();
        loc = id.location();
    }
    else {
        loc = syntax.expr->getFirstToken().location();
    }

    auto result = comp.emplace<CoverpointSymbol>(comp, name, loc);
    result->setSyntax(syntax);
    result->setAttributes(scope, syntax.attributes);

    result->declaredType.setTypeSyntax(*syntax.type);
    result->declaredType.setInitializerSyntax(*syntax.expr,
                                              syntax.expr->getFirstToken().location());

    OptionBuilder options(*result);
    for (auto member : syntax.members) {
        if (member->kind == SyntaxKind::CoverageOption)
            options.add(member->as<CoverageOptionSyntax>());
        else
            result->addMembers(*member);
    }

    result->options = options.get();
    return *result;
}